

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

ptls_hash_context_t * ptls_hmac_create(ptls_hash_algorithm_t *algo,void *key,size_t key_size)

{
  st_picotls_hmac_context_t *ctx;
  ptls_hash_context_t *ppVar1;
  
  if (algo->block_size < key_size) {
    __assert_fail("key_size <= algo->block_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x1371,
                  "ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *, const void *, size_t)"
                 );
  }
  ctx = (st_picotls_hmac_context_t *)malloc(algo->block_size + 0x28);
  if (ctx != (st_picotls_hmac_context_t *)0x0) {
    (ctx->super).update = hmac_update;
    (ctx->super).final = hmac_final;
    (ctx->super).clone_ = (_func_st_ptls_hash_context_t_ptr_st_ptls_hash_context_t_ptr *)0x0;
    ctx->algo = algo;
    ctx->key[0] = '\0';
    ppVar1 = (*algo->create)();
    ctx->hash = ppVar1;
    if (ppVar1 != (ptls_hash_context_t *)0x0) {
      memset(ctx->key,0,algo->block_size);
      memcpy(ctx->key,key,key_size);
      hmac_apply_key(ctx,'6');
      return &ctx->super;
    }
    free(ctx);
  }
  return (ptls_hash_context_t *)0x0;
}

Assistant:

ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *algo, const void *key, size_t key_size)
{
    struct st_picotls_hmac_context_t *ctx;

    assert(key_size <= algo->block_size);

    if ((ctx = malloc(offsetof(struct st_picotls_hmac_context_t, key) + algo->block_size)) == NULL)
        return NULL;

    *ctx = (struct st_picotls_hmac_context_t){{hmac_update, hmac_final}, algo};
    if ((ctx->hash = algo->create()) == NULL) {
        free(ctx);
        return NULL;
    }
    memset(ctx->key, 0, algo->block_size);
    memcpy(ctx->key, key, key_size);

    hmac_apply_key(ctx, 0x36);

    return &ctx->super;
}